

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Stream::setState(QHttp2Stream *this,State newState)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  State local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(State *)(this + 0x68) != newState) {
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
        != 0) {
      local_48._0_4_ = 2;
      local_48._4_4_ = 0;
      uStack_40._0_4_ = 0;
      uStack_40._4_4_ = 0;
      uStack_38 = 0;
      local_34 = 0;
      local_30 = qHttp2ConnectionLog::category.name;
      uVar1 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
      QMessageLogger::debug
                ((char *)&local_48,"[%p] stream %u, state changed from %d to %d",uVar1,
                 (ulong)*(uint *)(this + 0x10),(ulong)*(uint *)(this + 0x68),(ulong)newState);
    }
    *(State *)(this + 0x68) = newState;
    uStack_40 = &local_4c;
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    local_4c = newState;
    QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::setState(State newState)
{
    if (m_state == newState)
        return;
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u, state changed from %d to %d", getConnection(),
            streamID(), int(m_state), int(newState));
    m_state = newState;
    emit stateChanged(newState);
}